

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O2

int __thiscall muduo::FileUtil::ReadSmallFile::readToBuffer(ReadSmallFile *this,int *size)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = this->err_;
  if (-1 < this->fd_) {
    sVar1 = pread(this->fd_,this->buf_,0xffff,0);
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      iVar3 = *piVar2;
    }
    else {
      if (size != (int *)0x0) {
        *size = (int)sVar1;
      }
      this->buf_[sVar1] = '\0';
    }
  }
  return iVar3;
}

Assistant:

int FileUtil::ReadSmallFile::readToBuffer(int* size)
{
  int err = err_;
  if (fd_ >= 0)
  {
    ssize_t n = ::pread(fd_, buf_, sizeof(buf_)-1, 0);
    if (n >= 0)
    {
      if (size)
      {
        *size = static_cast<int>(n);
      }
      buf_[n] = '\0';
    }
    else
    {
      err = errno;
    }
  }
  return err;
}